

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFCrypto_openssl.cc
# Opt level: O1

void __thiscall QPDFCrypto_openssl::MD5_finalize(QPDFCrypto_openssl *this)

{
  long lVar1;
  int status;
  
  lVar1 = EVP_MD_CTX_get0_md(this->md_ctx);
  if (lVar1 != 0) {
    status = EVP_DigestFinal((EVP_MD_CTX *)this->md_ctx,this->md_out,(uint *)0x0);
    check_openssl(status);
    return;
  }
  return;
}

Assistant:

void
QPDFCrypto_openssl::MD5_finalize()
{
#ifdef QPDF_OPENSSL_1
    auto md = EVP_MD_CTX_md(md_ctx);
#else
    auto md = EVP_MD_CTX_get0_md(md_ctx);
#endif
    if (md) {
        check_openssl(EVP_DigestFinal(md_ctx, md_out + 0, nullptr));
    }
}